

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

Type ON_BinaryArchive::TableComponentType(ON_3dmArchiveTableType table_type)

{
  if (table_type == historyrecord_table) {
    return HistoryRecord;
  }
  if (table_type == texture_mapping_table) {
    return TextureMapping;
  }
  if (table_type == material_table) {
    return Material;
  }
  if (table_type == linetype_table) {
    return LinePattern;
  }
  if (table_type == layer_table) {
    return Layer;
  }
  if (table_type == group_table) {
    return Group;
  }
  if (table_type == text_style_table) {
    return TextStyle;
  }
  if (table_type != dimension_style_table) {
    if (table_type == light_table) {
      return RenderLight;
    }
    if (table_type == hatchpattern_table) {
      return HatchPattern;
    }
    if (table_type == instance_definition_table) {
      return InstanceDefinition;
    }
    if (table_type != object_table) {
      if (table_type == bitmap_table) {
        return Image;
      }
      return Unset;
    }
    return ModelGeometry;
  }
  return DimStyle;
}

Assistant:

ON_ModelComponent::Type ON_BinaryArchive::TableComponentType(
  ON_3dmArchiveTableType table_type
)
{
  ON_ModelComponent::Type model_component_type;
  switch (table_type)
  {
  case ON_3dmArchiveTableType::Unset:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::start_section:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::properties_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::settings_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::bitmap_table:
    model_component_type = ON_ModelComponent::Type::Image;
    break;
  case ON_3dmArchiveTableType::texture_mapping_table:
    model_component_type = ON_ModelComponent::Type::TextureMapping;
    break;
  case ON_3dmArchiveTableType::material_table:
    model_component_type = ON_ModelComponent::Type::RenderMaterial;
    break;
  case ON_3dmArchiveTableType::linetype_table:
    model_component_type = ON_ModelComponent::Type::LinePattern;
    break;
  case ON_3dmArchiveTableType::layer_table:
    model_component_type = ON_ModelComponent::Type::Layer;
    break;
  case ON_3dmArchiveTableType::group_table:
    model_component_type = ON_ModelComponent::Type::Group;
    break;
  case ON_3dmArchiveTableType::text_style_table:
    model_component_type = ON_ModelComponent::Type::TextStyle;
    break;
  case ON_3dmArchiveTableType::leader_style_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::dimension_style_table:
    model_component_type = ON_ModelComponent::Type::DimStyle;
    break;
  case ON_3dmArchiveTableType::light_table:
    model_component_type = ON_ModelComponent::Type::RenderLight;
    break;
  case ON_3dmArchiveTableType::hatchpattern_table:
    model_component_type = ON_ModelComponent::Type::HatchPattern;
    break;
  case ON_3dmArchiveTableType::instance_definition_table:
    model_component_type = ON_ModelComponent::Type::InstanceDefinition;
    break;
  case ON_3dmArchiveTableType::object_table:
    model_component_type = ON_ModelComponent::Type::ModelGeometry;
    break;
  case ON_3dmArchiveTableType::historyrecord_table:
    model_component_type = ON_ModelComponent::Type::HistoryRecord;
    break;
  case ON_3dmArchiveTableType::user_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::end_mark:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  default:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  }
  return model_component_type;
}